

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  char *pcVar10;
  char *pcVar11;
  FILE *__stream;
  uint uVar12;
  int iVar13;
  long lVar14;
  size_t sStack_70;
  run_mode_t local_64;
  undefined8 local_60;
  undefined8 local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (argc != 1) {
    pcVar11 = argv[1];
    cVar1 = *pcVar11;
    if ((((cVar1 != '-') || (pcVar11[1] != 'h')) || (pcVar11[2] != '\0')) &&
       (iVar5 = strcmp(pcVar11,"--help"), iVar5 != 0)) {
      if ((((cVar1 == '-') && (pcVar11[1] == 'v')) && (pcVar11[2] == '\0')) ||
         (iVar5 = strcmp(pcVar11,"--version"), iVar5 == 0)) {
        print_version();
        goto LAB_00108f62;
      }
      if (((argc < 3 || cVar1 != '-') || (pcVar11[1] != 'D')) || (pcVar11[2] != '\0')) {
        iVar5 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        if (iVar5 == 0) {
          sStack_70 = 1;
          goto LAB_001080b9;
        }
LAB_00108f2b:
        __stream = _stderr;
        puVar9 = (undefined4 *)coda_get_errno();
        pcVar11 = (char *)coda_errno_to_string(*puVar9);
        pcVar10 = "ERROR: %s\n";
LAB_00108f4e:
        fprintf(__stream,pcVar10,pcVar11);
        goto LAB_00108f55;
      }
      coda_set_definition_path(argv[2]);
      sStack_70 = 3;
LAB_001080b9:
      iVar13 = (int)sStack_70;
      pcVar11 = argv[sStack_70];
      iVar5 = strcmp(pcVar11,"list");
      if (iVar5 == 0) {
        run_mode = RUN_MODE_LIST;
        traverse_info.file_name = (char *)0x0;
        traverse_info.filter[0] = (codadump_filter *)0x0;
        uVar12 = iVar13 + 1;
        calc_dim = 0;
        iVar13 = argc - uVar12;
        show_dim_vals = 0;
        show_type = 0;
        verbosity = 1;
        show_unit = 0;
        show_description = 0;
        bVar3 = true;
        local_58 = 1;
        for (iVar5 = 0; iVar5 < iVar13; iVar5 = iVar5 + 1) {
          pcVar11 = argv[(ulong)uVar12 + (long)iVar5];
          cVar1 = *pcVar11;
          if ((((cVar1 == '-') && (pcVar11[1] == 'c')) && (pcVar11[2] == '\0')) ||
             (iVar6 = strcmp(pcVar11,"--calc_dim"), iVar6 == 0)) {
            calc_dim = 1;
            pcVar11 = traverse_info.file_name;
          }
          else if ((((cVar1 == '-') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) ||
                  (iVar6 = strcmp(pcVar11,"--disable_conversions"), iVar6 == 0)) {
            local_58 = 0;
            pcVar11 = traverse_info.file_name;
          }
          else if (((((cVar1 == '-') && (pcVar11[1] == 'f')) && (pcVar11[2] == '\0')) ||
                   (iVar6 = strcmp(pcVar11,"--filter"), iVar6 == 0)) &&
                  ((iVar6 = iVar5 + 1, iVar6 < iVar13 && (*argv[(ulong)uVar12 + (long)iVar6] != '-')
                   ))) {
            traverse_info.filter[0] = codadump_filter_create(argv[(ulong)uVar12 + (long)iVar6]);
            iVar5 = iVar6;
            pcVar11 = traverse_info.file_name;
            if (traverse_info.filter[0] == (codadump_filter *)0x0) goto LAB_00108f69;
          }
          else if (((cVar1 == '-') && ((pcVar11[1] == 't' && (pcVar11[2] == '\0')))) ||
                  (iVar6 = strcmp(pcVar11,"--type"), iVar6 == 0)) {
            show_type = 1;
            pcVar11 = traverse_info.file_name;
          }
          else if ((((cVar1 == '-') && (pcVar11[1] == 'u')) && (pcVar11[2] == '\0')) ||
                  (iVar6 = strcmp(pcVar11,"--unit"), iVar6 == 0)) {
            show_unit = 1;
            pcVar11 = traverse_info.file_name;
          }
          else {
            iVar6 = strcmp(pcVar11,"--description");
            if (iVar6 == 0) {
              show_description = 1;
              pcVar11 = traverse_info.file_name;
            }
            else {
              iVar6 = strcmp(pcVar11,"--dim_values");
              if (iVar6 == 0) {
                calc_dim = 1;
                pcVar11 = traverse_info.file_name;
                show_dim_vals = calc_dim;
              }
              else {
                iVar6 = strcmp(pcVar11,"--no_special_types");
                if (iVar6 == 0) {
                  bVar3 = false;
                  pcVar11 = traverse_info.file_name;
                }
                else if ((iVar5 != iVar13 + -1) || (iVar5 = iVar13 + -1, cVar1 == '-'))
                goto LAB_00108f01;
              }
            }
          }
          traverse_info.file_name = pcVar11;
        }
        if ((traverse_info.file_name != (char *)0x0) && (*traverse_info.file_name != '\0')) {
          iVar5 = coda_init();
          if (iVar5 == 0) {
            coda_set_option_bypass_special_types(!bVar3);
            coda_set_option_perform_boundary_checks(0);
            coda_set_option_perform_conversions(local_58);
            traverse_info_init();
            dim_info_init();
            traverse_product();
LAB_001089d9:
            dim_info_done();
            traverse_info_done();
            goto LAB_00108eeb;
          }
          goto LAB_00108f2b;
        }
      }
      else {
        iVar5 = strcmp(pcVar11,"ascii");
        if (iVar5 == 0) {
          run_mode = RUN_MODE_ASCII;
          traverse_info.file_name = (char *)0x0;
          uVar12 = iVar13 + 1;
          traverse_info.filter[0] = (codadump_filter *)0x0;
          iVar5 = argc - uVar12;
          output_file_name = (char *)0x0;
          ascii_col_sep = " ";
          show_index = 0;
          ascii_output = _stdout;
          show_label = 0;
          show_quotes = 0;
          show_time_as_string = 0;
          local_60 = 1;
          iVar13 = 0;
          verbosity = run_mode;
          calc_dim = run_mode;
          local_64 = run_mode;
          while (iVar13 < iVar5) {
            pcVar11 = argv[(ulong)uVar12 + (long)iVar13];
            cVar1 = *pcVar11;
            if ((((cVar1 == '-') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) ||
               (iVar6 = strcmp(pcVar11,"--disable_conversions"), iVar6 == 0)) {
              local_60 = 0;
              iVar6 = iVar13;
              pcVar10 = traverse_info.file_name;
              pcVar2 = ascii_col_sep;
              pcVar4 = output_file_name;
            }
            else if (((((cVar1 == '-') && (pcVar11[1] == 'f')) && (pcVar11[2] == '\0')) ||
                     (iVar6 = strcmp(pcVar11,"--filter"), iVar6 == 0)) &&
                    ((iVar6 = iVar13 + 1, iVar6 < iVar5 &&
                     (*argv[(ulong)uVar12 + (long)iVar6] != '-')))) {
              traverse_info.filter[0] = codadump_filter_create(argv[(ulong)uVar12 + (long)iVar6]);
              pcVar10 = traverse_info.file_name;
              pcVar2 = ascii_col_sep;
              pcVar4 = output_file_name;
              if (traverse_info.filter[0] == (codadump_filter *)0x0) goto LAB_00108f69;
            }
            else if ((((cVar1 == '-') && (pcVar11[1] == 'i')) && (pcVar11[2] == '\0')) ||
                    (iVar6 = strcmp(pcVar11,"--index"), iVar6 == 0)) {
              show_index = 1;
              iVar6 = iVar13;
              pcVar10 = traverse_info.file_name;
              pcVar2 = ascii_col_sep;
              pcVar4 = output_file_name;
            }
            else if ((((cVar1 == '-') && (pcVar11[1] == 'l')) && (pcVar11[2] == '\0')) ||
                    (iVar6 = strcmp(pcVar11,"--label"), iVar6 == 0)) {
              show_label = 1;
              iVar6 = iVar13;
              pcVar10 = traverse_info.file_name;
              pcVar2 = ascii_col_sep;
              pcVar4 = output_file_name;
            }
            else if (((((cVar1 != '-') || (pcVar11[1] != 'o')) || (pcVar11[2] != '\0')) &&
                     (iVar6 = strcmp(pcVar11,"--output"), iVar6 != 0)) ||
                    ((iVar6 = iVar13 + 1, iVar5 <= iVar6 ||
                     (pcVar10 = traverse_info.file_name, pcVar2 = ascii_col_sep,
                     pcVar4 = argv[(ulong)uVar12 + (long)iVar6],
                     *argv[(ulong)uVar12 + (long)iVar6] == '-')))) {
              if (((cVar1 == '-') && ((pcVar11[1] == 'q' && (pcVar11[2] == '\0')))) ||
                 (iVar6 = strcmp(pcVar11,"--quote_strings"), iVar6 == 0)) {
                show_quotes = 1;
                iVar6 = iVar13;
                pcVar10 = traverse_info.file_name;
                pcVar2 = ascii_col_sep;
                pcVar4 = output_file_name;
              }
              else if (((((cVar1 != '-') || (pcVar11[1] != 's')) || (pcVar11[2] != '\0')) &&
                       (iVar6 = strcmp(pcVar11,"--column_separator"), iVar6 != 0)) ||
                      ((iVar6 = iVar13 + 1, iVar5 <= iVar6 ||
                       (pcVar10 = traverse_info.file_name,
                       pcVar2 = argv[(ulong)uVar12 + (long)iVar6], pcVar4 = output_file_name,
                       *argv[(ulong)uVar12 + (long)iVar6] == '-')))) {
                if (((cVar1 == '-') && ((pcVar11[1] == 't' && (pcVar11[2] == '\0')))) ||
                   (iVar6 = strcmp(pcVar11,"--time_as_string"), iVar6 == 0)) {
                  show_time_as_string = 1;
                  iVar6 = iVar13;
                  pcVar10 = traverse_info.file_name;
                  pcVar2 = ascii_col_sep;
                  pcVar4 = output_file_name;
                }
                else {
                  iVar6 = strcmp(pcVar11,"--no_special_types");
                  pcVar2 = ascii_col_sep;
                  pcVar4 = output_file_name;
                  if (iVar6 == 0) {
                    local_64 = RUN_MODE_LIST;
                    iVar6 = iVar13;
                    pcVar10 = traverse_info.file_name;
                  }
                  else if ((iVar13 != iVar5 + -1) ||
                          (iVar6 = iVar5 + -1, pcVar10 = pcVar11, cVar1 == '-')) goto LAB_00108f01;
                }
              }
            }
            output_file_name = pcVar4;
            ascii_col_sep = pcVar2;
            traverse_info.file_name = pcVar10;
            iVar13 = iVar6 + 1;
          }
          if ((traverse_info.file_name != (char *)0x0) && (*traverse_info.file_name != '\0')) {
            iVar5 = coda_init();
            if (iVar5 != 0) goto LAB_00108f2b;
            coda_set_option_bypass_special_types(local_64 == RUN_MODE_LIST);
            coda_set_option_perform_boundary_checks(0);
            coda_set_option_perform_conversions(local_60);
            traverse_info_init();
            dim_info_init();
            if ((output_file_name == (char *)0x0) ||
               (ascii_output = (FILE *)fopen(output_file_name,"w"),
               (FILE *)ascii_output != (FILE *)0x0)) {
              traverse_product();
              if (output_file_name != (char *)0x0) {
                fclose((FILE *)ascii_output);
              }
              goto LAB_001089d9;
            }
LAB_00108f7e:
            pcVar10 = "ERROR: could not create output file \"%s\"\n";
            pcVar11 = output_file_name;
            __stream = _stderr;
            goto LAB_00108f4e;
          }
        }
        else {
          iVar5 = strcmp(pcVar11,"json");
          if (iVar5 == 0) {
            run_mode = RUN_MODE_JSON;
            traverse_info.file_name = (char *)0x0;
            uVar12 = iVar13 + 1;
            output_file_name = (char *)0x0;
            iVar13 = argc - uVar12;
            starting_path = (char *)0x0;
            ascii_output = _stdout;
            local_48 = (char *)0x0;
            local_64 = 1;
            iVar5 = 0;
            iVar6 = 0;
            local_4c = local_64;
            while (iVar6 < iVar13) {
              pcVar11 = argv[(ulong)uVar12 + (long)iVar6];
              cVar1 = *pcVar11;
              iVar8 = iVar6;
              if ((((cVar1 == '-') && (pcVar11[1] == 'a')) && (pcVar11[2] == '\0')) ||
                 (iVar7 = strcmp(pcVar11,"--attributes"), iVar7 == 0)) {
                iVar5 = 1;
                pcVar10 = traverse_info.file_name;
                pcVar2 = output_file_name;
                pcVar4 = starting_path;
              }
              else if ((((cVar1 == '-') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) ||
                      (iVar7 = strcmp(pcVar11,"--disable_conversions"), iVar7 == 0)) {
                local_64 = 0;
                pcVar10 = traverse_info.file_name;
                pcVar2 = output_file_name;
                pcVar4 = starting_path;
              }
              else if ((((((cVar1 != '-') || (pcVar11[1] != 'o')) || (pcVar11[2] != '\0')) &&
                        (iVar8 = strcmp(pcVar11,"--output"), iVar8 != 0)) ||
                       ((iVar8 = iVar6 + 1, iVar13 <= iVar8 ||
                        (pcVar10 = traverse_info.file_name,
                        pcVar2 = argv[(ulong)uVar12 + (long)iVar8], pcVar4 = starting_path,
                        *argv[(ulong)uVar12 + (long)iVar8] == '-')))) &&
                      ((((cVar1 != '-' || ((pcVar11[1] != 'p' || (pcVar11[2] != '\0')))) &&
                        (iVar8 = strcmp(pcVar11,"--path"), iVar8 != 0)) ||
                       ((iVar8 = iVar6 + 1, iVar13 <= iVar8 ||
                        (pcVar10 = traverse_info.file_name, pcVar2 = output_file_name,
                        pcVar4 = argv[(ulong)uVar12 + (long)iVar8],
                        *argv[(ulong)uVar12 + (long)iVar8] == '-')))))) {
                iVar8 = strcmp(pcVar11,"--no_special_types");
                pcVar2 = output_file_name;
                pcVar4 = starting_path;
                if (iVar8 == 0) {
                  local_4c = 0;
                  iVar8 = iVar6;
                  pcVar10 = traverse_info.file_name;
                }
                else if ((iVar6 != iVar13 + -1) ||
                        (iVar8 = iVar13 + -1, pcVar10 = pcVar11, local_48 = pcVar11, cVar1 == '-'))
                goto LAB_00108f01;
              }
              starting_path = pcVar4;
              output_file_name = pcVar2;
              traverse_info.file_name = pcVar10;
              iVar6 = iVar8 + 1;
            }
            if ((local_48 != (char *)0x0) && (*local_48 != '\0')) {
              iVar13 = coda_init();
              if (iVar13 != 0) goto LAB_00108f2b;
              coda_set_option_bypass_special_types(local_4c == 0);
              coda_set_option_perform_conversions(local_64);
              if ((output_file_name != (char *)0x0) &&
                 (ascii_output = (FILE *)fopen(output_file_name,"w"),
                 (FILE *)ascii_output == (FILE *)0x0)) goto LAB_00108f7e;
              print_json_data(iVar5);
LAB_00108ed5:
              if (output_file_name != (char *)0x0) {
                fclose((FILE *)ascii_output);
              }
LAB_00108eeb:
              coda_done();
              return 0;
            }
          }
          else {
            iVar5 = strcmp(pcVar11,"yaml");
            if (iVar5 == 0) {
              run_mode = RUN_MODE_YAML;
              traverse_info.file_name = (char *)0x0;
              uVar12 = iVar13 + 1;
              output_file_name = (char *)0x0;
              iVar13 = argc - uVar12;
              starting_path = (char *)0x0;
              ascii_output = _stdout;
              local_48 = (char *)0x0;
              local_64 = 1;
              iVar5 = 0;
              iVar6 = 0;
              local_4c = local_64;
              while (iVar6 < iVar13) {
                pcVar11 = argv[(ulong)uVar12 + (long)iVar6];
                cVar1 = *pcVar11;
                iVar8 = iVar6;
                if ((((cVar1 == '-') && (pcVar11[1] == 'a')) && (pcVar11[2] == '\0')) ||
                   (iVar7 = strcmp(pcVar11,"--attributes"), iVar7 == 0)) {
                  iVar5 = 1;
                  pcVar10 = traverse_info.file_name;
                  pcVar2 = output_file_name;
                  pcVar4 = starting_path;
                }
                else if ((((cVar1 == '-') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) ||
                        (iVar7 = strcmp(pcVar11,"--disable_conversions"), iVar7 == 0)) {
                  local_64 = 0;
                  pcVar10 = traverse_info.file_name;
                  pcVar2 = output_file_name;
                  pcVar4 = starting_path;
                }
                else if ((((((cVar1 != '-') || (pcVar11[1] != 'o')) || (pcVar11[2] != '\0')) &&
                          (iVar8 = strcmp(pcVar11,"--output"), iVar8 != 0)) ||
                         ((iVar8 = iVar6 + 1, iVar13 <= iVar8 ||
                          (pcVar10 = traverse_info.file_name,
                          pcVar2 = argv[(ulong)uVar12 + (long)iVar8], pcVar4 = starting_path,
                          *argv[(ulong)uVar12 + (long)iVar8] == '-')))) &&
                        ((((cVar1 != '-' || ((pcVar11[1] != 'p' || (pcVar11[2] != '\0')))) &&
                          (iVar8 = strcmp(pcVar11,"--path"), iVar8 != 0)) ||
                         ((iVar8 = iVar6 + 1, iVar13 <= iVar8 ||
                          (pcVar10 = traverse_info.file_name, pcVar2 = output_file_name,
                          pcVar4 = argv[(ulong)uVar12 + (long)iVar8],
                          *argv[(ulong)uVar12 + (long)iVar8] == '-')))))) {
                  iVar8 = strcmp(pcVar11,"--no_special_types");
                  pcVar2 = output_file_name;
                  pcVar4 = starting_path;
                  if (iVar8 == 0) {
                    local_4c = 0;
                    iVar8 = iVar6;
                    pcVar10 = traverse_info.file_name;
                  }
                  else if ((iVar6 != iVar13 + -1) ||
                          (iVar8 = iVar13 + -1, pcVar10 = pcVar11, local_48 = pcVar11, cVar1 == '-')
                          ) goto LAB_00108f01;
                }
                starting_path = pcVar4;
                output_file_name = pcVar2;
                traverse_info.file_name = pcVar10;
                iVar6 = iVar8 + 1;
              }
              if ((local_48 != (char *)0x0) && (*local_48 != '\0')) {
                iVar13 = coda_init();
                if (iVar13 != 0) goto LAB_00108f2b;
                coda_set_option_bypass_special_types(local_4c == 0);
                coda_set_option_perform_conversions(local_64);
                if ((output_file_name != (char *)0x0) &&
                   (ascii_output = (FILE *)fopen(output_file_name,"w"),
                   (FILE *)ascii_output == (FILE *)0x0)) goto LAB_00108f7e;
                print_yaml_data(iVar5);
                goto LAB_00108ed5;
              }
            }
            else {
              iVar5 = strcmp(pcVar11,"debug");
              if (iVar5 == 0) {
                local_64 = 1;
                traverse_info.file_name = (char *)0x0;
                run_mode = RUN_MODE_DEBUG;
                output_file_name = (char *)0x0;
                uVar12 = iVar13 + 1;
                starting_path = (char *)0x0;
                iVar5 = argc - uVar12;
                ascii_output = _stdout;
                local_48 = (char *)0x0;
                local_38 = (char *)0x0;
                local_40 = (char *)0x0;
                local_4c = 0;
                iVar13 = 0;
                while (iVar13 < iVar5) {
                  lVar14 = (long)iVar13;
                  pcVar11 = argv[(ulong)uVar12 + lVar14];
                  cVar1 = *pcVar11;
                  if ((((cVar1 == '-') && (pcVar11[1] == 'd')) && (pcVar11[2] == '\0')) ||
                     (iVar6 = strcmp(pcVar11,"--disable_fast_size_expressions"), iVar6 == 0)) {
                    local_64 = 0;
                    iVar6 = iVar13;
                    pcVar11 = traverse_info.file_name;
                  }
                  else if ((((((cVar1 == '-') && (pcVar11[1] == 'o')) && (pcVar11[2] == '\0')) ||
                            (iVar6 = strcmp(pcVar11,"--output"), iVar6 == 0)) &&
                           ((iVar13 + 1 < iVar5 &&
                            (pcVar10 = argv[(ulong)uVar12 + (long)(iVar13 + 1)],
                            pcVar2 = starting_path, *argv[(ulong)uVar12 + (long)(iVar13 + 1)] != '-'
                            )))) || ((((cVar1 == '-' &&
                                       ((pcVar11[1] == 'p' && (pcVar11[2] == '\0')))) ||
                                      (iVar6 = strcmp(pcVar11,"--path"), iVar6 == 0)) &&
                                     ((iVar13 + 1 < iVar5 &&
                                      (pcVar10 = output_file_name,
                                      pcVar2 = argv[(ulong)uVar12 + (long)(iVar13 + 1)],
                                      *argv[(ulong)uVar12 + (long)(iVar13 + 1)] != '-')))))) {
                    starting_path = pcVar2;
                    output_file_name = pcVar10;
                    iVar6 = iVar13 + 1;
                    pcVar11 = traverse_info.file_name;
                  }
                  else {
                    iVar6 = strcmp(pcVar11,"--max_depth");
                    if ((iVar6 == 0) &&
                       ((iVar6 = iVar13 + 1, iVar6 < iVar5 &&
                        (*argv[(ulong)uVar12 + (long)iVar6] != '-')))) {
                      max_depth = atoi(argv[(ulong)uVar12 + (long)iVar6]);
                      pcVar11 = traverse_info.file_name;
                    }
                    else {
                      iVar6 = strcmp(pcVar11,"--open_as");
                      if ((iVar6 == 0) &&
                         ((((iVar6 = iVar13 + 3, iVar6 < iVar5 &&
                            (pcVar10 = argv[(ulong)uVar12 + lVar14 + 1], *pcVar10 != '-')) &&
                           (pcVar2 = argv[(ulong)uVar12 + lVar14 + 2], *pcVar2 != '-')) &&
                          (*argv[(ulong)uVar12 + (long)iVar6] != '-')))) {
                        local_4c = atoi(argv[(ulong)uVar12 + (long)iVar6]);
                        pcVar11 = traverse_info.file_name;
                        local_40 = pcVar2;
                        local_38 = pcVar10;
                      }
                      else if ((iVar13 != iVar5 + -1) ||
                              (iVar6 = iVar5 + -1, local_48 = pcVar11, cVar1 == '-'))
                      goto LAB_00108f01;
                    }
                  }
                  traverse_info.file_name = pcVar11;
                  iVar13 = iVar6 + 1;
                }
                if ((local_48 != (char *)0x0) && (*local_48 != '\0')) {
                  iVar5 = coda_init();
                  if (iVar5 != 0) goto LAB_00108f2b;
                  coda_set_option_perform_conversions(0);
                  coda_set_option_use_fast_size_expressions(local_64);
                  if ((output_file_name != (char *)0x0) &&
                     (ascii_output = (FILE *)fopen(output_file_name,"w"),
                     (FILE *)ascii_output == (FILE *)0x0)) goto LAB_00108f7e;
                  print_debug_data(local_38,local_40,local_4c);
                  goto LAB_00108ed5;
                }
              }
            }
          }
        }
      }
LAB_00108f01:
      pcVar11 = "ERROR: invalid arguments\n";
      sStack_70 = 0x19;
      goto LAB_00108f14;
    }
  }
  print_help();
LAB_00108f62:
  exit(0);
LAB_00108f69:
  pcVar11 = "ERROR: incorrect filter or empty filter\n";
  sStack_70 = 0x28;
LAB_00108f14:
  fwrite(pcVar11,sStack_70,1,_stderr);
  print_help();
LAB_00108f55:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    int i;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    if (strcmp(argv[i], "list") == 0)
    {
        run_mode = RUN_MODE_LIST;
        i++;
        handle_list_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "ascii") == 0)
    {
        run_mode = RUN_MODE_ASCII;
        i++;
        handle_ascii_run_mode(argc - i, &argv[i]);
    }
#ifdef HAVE_HDF4
    else if (strcmp(argv[i], "hdf4") == 0)
    {
        run_mode = RUN_MODE_HDF4;
        i++;
        handle_hdf4_run_mode(argc - i, &argv[i]);
    }
#endif
    else if (strcmp(argv[i], "json") == 0)
    {
        run_mode = RUN_MODE_JSON;
        i++;
        handle_json_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "yaml") == 0)
    {
        run_mode = RUN_MODE_YAML;
        i++;
        handle_yaml_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "debug") == 0)
    {
        run_mode = RUN_MODE_DEBUG;
        i++;
        handle_debug_run_mode(argc - i, &argv[i]);
    }
    else
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    return 0;
}